

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O1

void testLineOrder(string *tempDir)

{
  ulong uVar1;
  float fVar2;
  pointer pcVar3;
  _Alloc_hider __filename;
  byte bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long *plVar12;
  ostream *poVar13;
  int *piVar14;
  char *pcVar15;
  long lVar16;
  void *pvVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  float *pfVar20;
  float *pfVar21;
  _Rb_tree_node_base *p_Var22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  undefined4 uVar25;
  undefined8 uVar26;
  int iVar27;
  void *pvVar28;
  ulong uVar29;
  ulong uVar30;
  int i;
  long lVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  string filename;
  FrameBuffer fb;
  Header hdr;
  InputFile in;
  OutputFile out;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing line order and random access to scan lines",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  pcVar11 = (char *)operator_new__(0x58aa);
  testLineOrder();
  bVar4 = IlmThread_3_2::supportsThreads();
  uVar10 = 0;
  do {
    cVar5 = IlmThread_3_2::supportsThreads();
    if (cVar5 != '\0') {
      Imf_3_2::setGlobalThreadCount(uVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar6 = Imf_3_2::globalThreadCount();
      plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      std::ostream::flush();
    }
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    pcVar3 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&filename,pcVar3,pcVar3 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&filename);
    iVar6 = 0;
    do {
      __filename._M_p = filename._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"line order ",0xb);
      poVar13 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,":",1);
      std::ostream::flush();
      _out = 0;
      Imf_3_2::Header::Header(&hdr,0x75,0x61,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar14 = (int *)Imf_3_2::Header::lineOrder();
      *piVar14 = iVar6;
      pcVar15 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar15,(Channel *)0x1ca1d4);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar11,2,0xea,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(__filename._M_p);
      iVar7 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar7);
      Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_2::OutputFile::writePixels((int)(Channel *)&out);
      Imf_3_2::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar7 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&in,__filename._M_p,iVar7);
      Imf_3_2::InputFile::header();
      piVar14 = (int *)Imf_3_2::Header::dataWindow();
      iVar7 = *piVar14;
      lVar31 = (long)piVar14[2] - (long)iVar7;
      uVar1 = lVar31 + 1;
      iVar27 = piVar14[1];
      iVar8 = piVar14[3] - iVar27;
      uVar9 = iVar8 + 1;
      lVar16 = (long)(int)uVar9 * uVar1;
      uVar29 = lVar16 * 2;
      if (lVar16 < 0) {
        uVar29 = 0xffffffffffffffff;
      }
      pvVar17 = operator_new__(uVar29);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar26 = 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,
                 (char *)((long)pvVar17 + (long)iVar7 * -2 + (long)-iVar27 * uVar1 * 2),2,uVar1 * 2,
                 1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&in);
      iVar7 = 0;
      do {
        for (iVar27 = piVar14[1] + iVar7; uVar25 = (undefined4)uVar26, iVar27 <= piVar14[3];
            iVar27 = iVar27 + 7) {
          Imf_3_2::InputFile::readPixels((int)&in);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::InputFile::header();
      puVar18 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar19 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar7 = -(uint)((int)*puVar19 == (int)*puVar18);
      iVar27 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
      auVar33._4_4_ = iVar7;
      auVar33._0_4_ = iVar7;
      auVar33._8_4_ = iVar27;
      auVar33._12_4_ = iVar27;
      iVar7 = movmskpd(uVar25,auVar33);
      if ((iVar7 != 3) ||
         (iVar27 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
         iVar37 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
         auVar34._4_4_ = iVar27, auVar34._0_4_ = iVar27, auVar34._8_4_ = iVar37,
         auVar34._12_4_ = iVar37, iVar27 = movmskpd((int)puVar19,auVar34), iVar27 != 3)) {
        __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x81,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar27 = -(uint)((int)*puVar19 == (int)*puVar18);
      iVar37 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
      auVar35._4_4_ = iVar27;
      auVar35._0_4_ = iVar27;
      auVar35._8_4_ = iVar37;
      auVar35._12_4_ = iVar37;
      iVar7 = movmskpd(iVar7,auVar35);
      if ((iVar7 != 3) ||
         (iVar7 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
         iVar27 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
         auVar36._4_4_ = iVar7, auVar36._0_4_ = iVar7, auVar36._8_4_ = iVar27,
         auVar36._12_4_ = iVar27, iVar7 = movmskpd((int)puVar19,auVar36), iVar7 != 3)) {
        __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x82,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar2 = *pfVar20;
      pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar2 != *pfVar20) || (NAN(fVar2) || NAN(*pfVar20))) {
        __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x83,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar21 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar20 != *pfVar21) || (NAN(*pfVar20) || NAN(*pfVar21))) ||
          (pfVar20[1] != pfVar21[1])) || (NAN(pfVar20[1]) || NAN(pfVar21[1]))) {
        __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x85,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar2 = *pfVar20;
      pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar2 != *pfVar20) || (NAN(fVar2) || NAN(*pfVar20))) {
        __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x86,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar14 = (int *)Imf_3_2::Header::lineOrder();
      iVar7 = *piVar14;
      piVar14 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar7 != *piVar14) {
        __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x87,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::InputFile::header();
      piVar14 = (int *)Imf_3_2::Header::compression();
      iVar7 = *piVar14;
      piVar14 = (int *)Imf_3_2::Header::compression();
      if (iVar7 != *piVar14) {
        __assert_fail("in.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x88,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      Imf_3_2::Header::channels();
      p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (p_Var22 == p_Var24) break;
        iVar7 = strcmp((char *)(p_Var22 + 1),(char *)(p_Var23 + 1));
        if (iVar7 != 0) {
          __assert_fail("!strcmp (hi.name (), ii.name ())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x8f,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (p_Var22[9]._M_color != p_Var23[9]._M_color) {
          __assert_fail("hi.channel ().type == ii.channel ().type",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x90,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var22[9].field_0x4 != *(int *)&p_Var23[9].field_0x4) {
          __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x91,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        if (*(int *)&p_Var22[9]._M_parent != *(int *)&p_Var23[9]._M_parent) {
          __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                        ,0x92,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                       );
        }
        p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
      }
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::channels();
      p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var23 != p_Var22) {
        __assert_fail("ii == in.header ().channels ().end ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                      ,0x98,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                     );
      }
      if (-1 < iVar8) {
        uVar29 = 0;
        pcVar15 = pcVar11;
        pvVar28 = pvVar17;
        do {
          if (-1 < (int)lVar31) {
            uVar30 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar15 + uVar30 * 2) * 4);
              pfVar20 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)((long)pvVar28 + uVar30 * 2) * 4);
              if ((fVar2 != *pfVar20) || (NAN(fVar2) || NAN(*pfVar20))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testLineOrder.cpp"
                              ,0x9c,
                              "void (anonymous namespace)::writeRead(const Array2D<half> &, const char *, int, int, LineOrder)"
                             );
              }
              uVar30 = uVar30 + 1;
            } while ((uVar1 & 0xffffffff) != uVar30);
          }
          uVar29 = uVar29 + 1;
          pvVar28 = (void *)((long)pvVar28 + uVar1 * 2);
          pcVar15 = pcVar15 + 0xea;
        } while (uVar29 != uVar9);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar17);
      Imf_3_2::InputFile::~InputFile(&in);
      remove(__filename._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      Imf_3_2::Header::~Header(&hdr);
      bVar32 = iVar6 == 0;
      iVar6 = iVar6 + 1;
    } while (bVar32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
    }
    bVar32 = uVar10 < 3;
    uVar10 = uVar10 + 1;
    if ((bVar4 & bVar32) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      operator_delete__(pcVar11);
      return;
    }
  } while( true );
}

Assistant:

void
testLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line order and random access to scan lines" << endl;

        const int W = 117;
        const int H = 97;

        Array2D<half> ph (H, W);
        fillPixels (ph, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            std::string filename = tempDir + "imf_test_lorder.exr";

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                writeRead (ph, filename.c_str (), W, H, LineOrder (lorder));
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}